

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O1

string * __thiscall
multi_agent_planning::PlanningAgent::planToString_abi_cxx11_
          (string *__return_storage_ptr__,PlanningAgent *this,Plan *plan)

{
  ostream *poVar1;
  pointer pPVar2;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Plan for agent ",0xf);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,this->agent_id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  pPVar2 = (plan->actions).
           super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (pPVar2 != (plan->actions).
                super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != (plan->actions).
                       super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"  (cost: ",9);
  poVar1 = std::ostream::_M_insert<double>((double)plan->cost);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string PlanningAgent::planToString(const Plan& plan) {
	stringstream ss;

	ss << "Plan for agent " << agent_id << ": ";

	//ss << "  states: ";
	
	auto it = plan.actions.begin();
	ss << it->source << " ";
	for (; it != plan.actions.end(); ++it) {
		ss << it->target << " ";
	}

	//ss << endl;

	/*
	it = plan.actions.begin();
	for (; it != plan.actions.end(); ++it) {
		ss << "time " << it->start_time << ": " << it->edge << endl;
	}
	*/
	

	ss << "  (cost: " << plan.cost << ")" << endl;

	//ss << "------------------------" << endl;

	return ss.str();
}